

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

string * glcts::anon_unknown_0::ShaderSourceFactory::generateShader
                   (string *__return_storage_ptr__,ShaderKey *key,
                   vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   *uniforms,
                   vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                   *subroutineUniforms,string *additionalDef,ContextType type)

{
  GLenum GVar1;
  string *additionalDef_local;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *subroutineUniforms_local;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  *uniforms_local;
  ShaderKey *key_local;
  ContextType type_local;
  
  GVar1 = key->stage;
  if (GVar1 == 0x8b30) {
    generateFragmentShader
              (__return_storage_ptr__,key,uniforms,subroutineUniforms,additionalDef,type);
  }
  else if (GVar1 == 0x8b31) {
    generateVertexShader(__return_storage_ptr__,key,uniforms,subroutineUniforms,additionalDef,type);
  }
  else {
    if (GVar1 != 0x91b9) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                    ,0x4b4,
                    "static std::string glcts::(anonymous namespace)::ShaderSourceFactory::generateShader(const ShaderKey &, const std::vector<Uniform> &, const std::vector<SubroutineUniform> &, const std::string &, const glu::ContextType)"
                   );
    }
    generateComputeShader(__return_storage_ptr__,key,uniforms,subroutineUniforms,additionalDef,type)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string generateShader(const ShaderKey& key, const std::vector<Uniform>& uniforms,
									  const std::vector<SubroutineUniform>& subroutineUniforms,
									  const std::string& additionalDef, const glu::ContextType type)
	{

		switch (key.stage)
		{
		case GL_VERTEX_SHADER:
			return generateVertexShader(key, uniforms, subroutineUniforms, additionalDef, type);
		case GL_FRAGMENT_SHADER:
			return generateFragmentShader(key, uniforms, subroutineUniforms, additionalDef, type);
			break;
		case GL_COMPUTE_SHADER:
			return generateComputeShader(key, uniforms, subroutineUniforms, additionalDef, type);
			break;
		default:
			assert(0);
			return "";
		}
	}